

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

void __thiscall
cfd::CoinSelection::ApproximateBestSubset
          (CoinSelection *this,vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *utxos,
          int64_t n_total_value,int64_t n_target_value,vector<char,_std::allocator<char>_> *vf_best,
          int64_t *n_best,int iterations)

{
  CfdException *this_00;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  int n_pass;
  uint uVar6;
  bool bVar7;
  allocator local_71;
  int local_70;
  int local_6c;
  vector<char,_std::allocator<char>_> vf_includes;
  
  if ((vf_best != (vector<char,_std::allocator<char>_> *)0x0) && (n_best != (int64_t *)0x0)) {
    vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_71 = (allocator)0x1;
    std::vector<char,_std::allocator<char>_>::_M_fill_assign
              (vf_best,(long)(utxos->
                             super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(utxos->
                             super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&local_71
              );
    *n_best = n_total_value;
    iVar1 = 0;
    local_70 = iterations;
    if (iterations < 1) {
      local_70 = 0;
    }
    while ((iVar1 != local_70 && (*n_best != n_target_value))) {
      local_71 = (allocator)0x0;
      local_6c = iVar1;
      std::vector<char,_std::allocator<char>_>::_M_fill_assign
                (&vf_includes,
                 (long)(utxos->
                       super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(utxos->
                       super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&local_71);
      lVar4 = 0;
      bVar5 = false;
      uVar6 = 0;
      while ((uVar6 < 2 && (!bVar5))) {
        bVar5 = false;
        for (uVar2 = 0; uVar3 = (ulong)uVar2,
            uVar3 < (ulong)((long)(utxos->
                                  super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(utxos->
                                  super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar2 = uVar2 + 1) {
          bVar7 = vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3] == '\0';
          if (uVar6 == 0) {
            bVar7 = core::RandomNumberUtil::GetRandomBool
                              ((vector<bool,_std::allocator<bool>_> *)&this->randomize_cache_);
          }
          if (bVar7 != false) {
            lVar4 = lVar4 + (utxos->
                            super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar3]->effective_k_value;
            vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3] = '\x01';
            if (n_target_value <= lVar4) {
              if (lVar4 < *n_best) {
                *n_best = lVar4;
                std::vector<char,_std::allocator<char>_>::operator=(vf_best,&vf_includes);
              }
              lVar4 = lVar4 - (utxos->
                              super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar3]->effective_k_value;
              vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3] = '\0';
              bVar5 = true;
            }
          }
        }
        uVar6 = uVar6 + 1;
      }
      iVar1 = local_6c + 1;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vf_includes.super__Vector_base<char,_std::allocator<char>_>);
    return;
  }
  vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = "cfd_utxo.cpp";
  vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,0x376);
  vf_includes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = "ApproximateBestSubset";
  core::logger::warn<>((CfdSourceLocation *)&vf_includes,"Outparameter(select_value) is nullptr.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&vf_includes,"Failed to select coin. Outparameter is nullptr.",&local_71);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&vf_includes);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CoinSelection::ApproximateBestSubset(
    const std::vector<const Utxo*>& utxos, int64_t n_total_value,
    int64_t n_target_value, std::vector<char>* vf_best, int64_t* n_best,
    int iterations) {
  if (vf_best == nullptr || n_best == nullptr) {
    warn(CFD_LOG_SOURCE, "Outparameter(select_value) is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to select coin. Outparameter is nullptr.");
  }

  std::vector<char> vf_includes;
  vf_best->assign(utxos.size(), true);
  *n_best = n_total_value;

  for (int n_rep = 0; n_rep < iterations && *n_best != n_target_value;
       n_rep++) {
    vf_includes.assign(utxos.size(), false);
    int64_t n_total = 0;
    bool is_reached_target = false;
    for (int n_pass = 0; n_pass < 2 && !is_reached_target; n_pass++) {
      for (unsigned int i = 0; i < utxos.size(); i++) {
        // The solver here uses a randomized algorithm,
        // the randomness serves no real security purpose but is just
        // needed to prevent degenerate behavior and it is important
        // that the rng is fast. We do not use a constant random sequence,
        // because there may be some privacy improvement by making
        // the selection random.
        bool rand_bool = !vf_includes[i];
        if (n_pass == 0) {
          rand_bool = RandomNumberUtil::GetRandomBool(&randomize_cache_);
        }
        if (rand_bool) {
          // n_total += utxos[i]->amount;
          n_total += utxos[i]->effective_k_value;
          vf_includes[i] = true;
          if (n_total >= n_target_value) {
            is_reached_target = true;
            if (n_total < *n_best) {
              *n_best = n_total;
              *vf_best = vf_includes;
            }
            // n_total -= utxos[i]->amount;
            n_total -= utxos[i]->effective_k_value;
            vf_includes[i] = false;
          }
        }
      }
    }
  }
}